

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

bool ON_IsRightHandFrame(ON_3dVector *X,ON_3dVector *Y,ON_3dVector *Z)

{
  bool bVar1;
  ON_3dVector local_30;
  
  bVar1 = ON_IsOrthonormalFrame(X,Y,Z);
  if (bVar1) {
    ON_3dVector::ON_3dVector
              (&local_30,X->y * Y->z - X->z * Y->y,X->z * Y->x - Y->z * X->x,
               X->x * Y->y - X->y * Y->x);
    bVar1 = 1.490116119385e-08 < local_30.z * Z->z + local_30.x * Z->x + local_30.y * Z->y;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_IsRightHandFrame( const ON_3dVector& X,  const ON_3dVector& Y,  const ON_3dVector& Z )
{
  // returns true if X, Y, Z is an orthonormal right hand frame
  if ( !ON_IsOrthonormalFrame(X,Y,Z) )
    return false;
  double x = ON_DotProduct( ON_CrossProduct( X, Y ), Z );
  if ( x <=  ON_SQRT_EPSILON )
    return false;
  return true;
}